

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* tinyusdz::prim::VisibilityEnumHandler
            (expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *tok)

{
  initializer_list<std::pair<tinyusdz::Visibility,_const_char_*>_> __l;
  pair<tinyusdz::Visibility,_const_char_*> pVar1;
  allocator local_91;
  string local_90;
  allocator<std::pair<tinyusdz::Visibility,_const_char_*>_> local_69;
  Visibility local_68 [2];
  pair<tinyusdz::Visibility,_const_char_*> local_60;
  Visibility local_50;
  char *local_48;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
  enums;
  string *tok_local;
  
  local_68[1] = 0;
  enums.
  super__Vector_base<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tok;
  pVar1 = ::std::make_pair<tinyusdz::Visibility,char_const(&)[10]>
                    (local_68 + 1,(char (*) [10])"inherited");
  local_60.second = pVar1.second;
  local_60.first = pVar1.first;
  local_68[0] = Invisible;
  pVar1 = ::std::make_pair<tinyusdz::Visibility,char_const(&)[10]>
                    (local_68,(char (*) [10])"invisible");
  local_48 = pVar1.second;
  local_50 = pVar1.first;
  local_40 = &local_60;
  local_38 = 2;
  ::std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = local_40;
  ::std::
  vector<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
  ::vector((vector<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
            *)local_30,__l,&local_69);
  ::std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>::~allocator(&local_69);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_90,"visibility",&local_91);
  anon_unknown_0::EnumHandler<tinyusdz::Visibility>
            (__return_storage_ptr__,&local_90,
             (string *)
             enums.
             super__Vector_base<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
              *)local_30);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  ::std::
  vector<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
  ::~vector((vector<std::pair<tinyusdz::Visibility,_const_char_*>,_std::allocator<std::pair<tinyusdz::Visibility,_const_char_*>_>_>
             *)local_30);
  return __return_storage_ptr__;
}

Assistant:

static nonstd::expected<Visibility, std::string> VisibilityEnumHandler(const std::string &tok) {
  using EnumTy = std::pair<Visibility, const char *>;
  const std::vector<EnumTy> enums = {
      std::make_pair(Visibility::Inherited, "inherited"),
      std::make_pair(Visibility::Invisible, "invisible"),
  };
  return EnumHandler<Visibility>(kVisibility, tok, enums);
}